

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<bool_(henson::Puppet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/puppet.cpp:29:30)>
::do_call(Proxy_Function_Callable_Impl<bool_(henson::Puppet_&),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_puppet_cpp:29:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  source_loc loc;
  Result_Type this_00;
  Type_Conversions_State *in_RCX;
  string_view_t fmt;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  Boxed_Value BVar2;
  
  this_00 = boxed_cast<henson::Puppet&>
                      ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  std::__cxx11::string::_M_assign((string *)&active_puppet_abi_cxx11_);
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x12;
  fmt.data_ = "Proceeding with {}";
  spdlog::logger::log_<std::__cxx11::string_const&>
            (logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,loc,debug,
             fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  henson::Coroutine<henson::Puppet>::proceed(&this_00->super_Coroutine<henson::Puppet>);
  sVar1 = Boxed_Value::Object_Data::get<bool>
                    ((Object_Data *)this,
                     (this_00->super_Coroutine<henson::Puppet>).super_BaseCoroutine.running_,true);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }